

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_chlist(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_chlist_t *attrdata,char *aname,char *tname,int32_t attrsz)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  exr_result_t eVar4;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  exr_result_t rv;
  int32_t maxlen;
  uint8_t flags [4];
  int32_t ysamp;
  int32_t xsamp;
  int32_t ptype;
  int32_t chlen;
  char chname [256];
  uint in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  uint32_t in_stack_fffffffffffffec0;
  int32_t in_stack_fffffffffffffec4;
  int iVar5;
  _internal_exr_seq_scratch *in_stack_fffffffffffffec8;
  exr_perceptual_treatment_t in_stack_ffffffffffffff0c;
  exr_pixel_type_t in_stack_ffffffffffffff10;
  int32_t in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  exr_attr_chlist_t *in_stack_ffffffffffffff20;
  exr_context_t in_stack_ffffffffffffff28;
  int32_t in_stack_ffffffffffffff40;
  int32_t in_stack_ffffffffffffff48;
  int local_34;
  
  uVar2 = (uint)*(byte *)(in_RDI + 2);
  iVar3 = check_bad_attrsz(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                           in_stack_fffffffffffffec0,
                           (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (char *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),
                           (int32_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  local_34 = in_R9D;
  while( true ) {
    uVar1 = in_stack_fffffffffffffea8 & 0xffffff;
    if (iVar3 == 0) {
      uVar1 = CONCAT13(0 < local_34,(int3)in_stack_fffffffffffffea8);
    }
    in_stack_fffffffffffffea8 = uVar1;
    if ((char)(in_stack_fffffffffffffea8 >> 0x18) == '\0') break;
    iVar5 = 0;
    iVar3 = read_text((char *)in_stack_fffffffffffffec8,(int32_t *)(ulong)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc,
                      (_internal_exr_seq_scratch *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),
                      (char *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
    if ((iVar3 != 0) || (local_34 = local_34 - (iVar5 + 1), iVar5 == 0)) break;
    if (local_34 < 0x10) {
      (**(code **)(in_RSI + 0x28))(in_RSI,local_34);
      eVar4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x11,"Out of data parsing \'%s\', last channel \'%s\'",in_RCX,
                         &stack0xfffffffffffffec8);
      return eVar4;
    }
    iVar3 = (**(code **)(in_RSI + 0x20))(in_RSI,&stack0xfffffffffffffec0,4);
    if ((((iVar3 != 0) ||
         (iVar3 = (**(code **)(in_RSI + 0x20))(in_RSI,&stack0xfffffffffffffeb4,4), iVar3 != 0)) ||
        (iVar3 = (**(code **)(in_RSI + 0x20))(in_RSI,&stack0xfffffffffffffebc,4), iVar3 != 0)) ||
       (iVar3 = (**(code **)(in_RSI + 0x20))(in_RSI,&stack0xfffffffffffffeb8,4), iVar3 != 0)) break;
    local_34 = local_34 + -0x10;
    in_stack_fffffffffffffec0 = one_to_native32(0);
    in_stack_fffffffffffffebc = one_to_native32(0);
    one_to_native32(0);
    if (((int)in_stack_fffffffffffffec0 < 0) || (3 < (int)in_stack_fffffffffffffec0)) {
      in_stack_fffffffffffffec0 = 3;
    }
    iVar3 = exr_attr_chlist_add_with_length
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff0c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48
                      );
  }
  (**(code **)(in_RSI + 0x28))(in_RSI,local_34);
  return iVar3;
}

Assistant:

static exr_result_t
extract_attr_chlist (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_chlist_t*                attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    char         chname[256];
    int32_t      chlen;
    int32_t      ptype, xsamp, ysamp;
    uint8_t      flags[4];
    int32_t      maxlen = ctxt->max_name_length;
    exr_result_t rv;

    rv = check_bad_attrsz (scratch, attrsz, 1, aname, tname, &chlen);

    while (rv == EXR_ERR_SUCCESS && attrsz > 0)
    {
        chlen = 0;
        rv    = read_text (chname, &chlen, maxlen, scratch, aname);
        if (rv != EXR_ERR_SUCCESS) break;
        attrsz -= chlen + 1;

        if (chlen == 0) break;

        if (attrsz < 16)
        {
            scratch->sequential_skip (scratch, attrsz);
            return ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_SIZE_MISMATCH,
                "Out of data parsing '%s', last channel '%s'",
                aname,
                chname);
        }

        rv = scratch->sequential_read (scratch, &ptype, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &flags, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &xsamp, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &ysamp, 4);
        if (rv != EXR_ERR_SUCCESS) break;

        attrsz -= 16;
        ptype = (int32_t) one_to_native32 ((uint32_t) ptype);
        xsamp = (int32_t) one_to_native32 ((uint32_t) xsamp);
        ysamp = (int32_t) one_to_native32 ((uint32_t) ysamp);

        if (ptype < 0 || ptype > (int)EXR_PIXEL_LAST_TYPE)
            ptype = (int)EXR_PIXEL_LAST_TYPE;

        rv = exr_attr_chlist_add_with_length (
            ctxt,
            attrdata,
            chname,
            chlen,
            (exr_pixel_type_t) ptype,
            flags[0],
            xsamp,
            ysamp);
    }
    scratch->sequential_skip (scratch, attrsz);
    return rv;
}